

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rename.c
# Opt level: O0

int rename(char *__old,char *__new)

{
  int iVar1;
  _PDCLIB_file_t *local_28;
  _PDCLIB_file_t *current;
  char *newpath_local;
  char *oldpath_local;
  
  mtx_lock(&_PDCLIB_filelist_mtx);
  local_28 = _PDCLIB_filelist;
  while( true ) {
    if (local_28 == (_PDCLIB_file_t *)0x0) {
      mtx_unlock(&_PDCLIB_filelist_mtx);
      iVar1 = _PDCLIB_rename(__old,__new);
      return iVar1;
    }
    if ((local_28->filename != (char *)0x0) &&
       (iVar1 = strcmp(local_28->filename,__old), iVar1 == 0)) break;
    local_28 = local_28->next;
  }
  mtx_unlock(&_PDCLIB_filelist_mtx);
  return -1;
}

Assistant:

int rename( const char * oldpath, const char * newpath )
{
    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );

    {
        struct _PDCLIB_file_t * current = _PDCLIB_filelist;

        while ( current != NULL )
        {
            if ( ( current->filename != NULL ) && ( strcmp( current->filename, oldpath ) == 0 ) )
            {
                /* File of that name currently open. Do not rename. */
                _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
                return EOF;
            }

            current = current->next;
        }
    }

    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    return _PDCLIB_rename( oldpath, newpath );
}